

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerGL::CheckResources
          (ShaderVariableManagerGL *this,IResourceMapping *pResourceMapping,
          BIND_SHADER_RESOURCES_FLAGS Flags,SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes)

{
  anon_class_32_4_f73c7e20 HandleUB;
  anon_class_32_4_f73c7e20 HandleTexture;
  anon_class_32_4_f73c7e20 HandleImage;
  anon_class_32_4_f73c7e20 HandleStorageBuffer;
  ResourceCacheContentType RVar1;
  BIND_SHADER_RESOURCES_FLAGS BVar2;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS local_2c;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *pSStack_28;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS AllowedTypes;
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes_local;
  IResourceMapping *pIStack_18;
  BIND_SHADER_RESOURCES_FLAGS Flags_local;
  IResourceMapping *pResourceMapping_local;
  ShaderVariableManagerGL *this_local;
  
  pSStack_28 = StaleVarTypes;
  StaleVarTypes_local._4_4_ = Flags;
  pIStack_18 = pResourceMapping;
  pResourceMapping_local = (IResourceMapping *)this;
  BVar2 = Diligent::operator&(Flags,BIND_SHADER_RESOURCES_UPDATE_ALL);
  if (BVar2 == 0) {
    operator|=((BIND_SHADER_RESOURCES_FLAGS *)((long)&StaleVarTypes_local + 4),
               BIND_SHADER_RESOURCES_UPDATE_ALL);
  }
  RVar1 = ShaderResourceCacheGL::GetContentType
                    ((this->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                     m_ResourceCache);
  local_2c = SHADER_RESOURCE_VARIABLE_TYPE_FLAG_STATIC;
  if (RVar1 == SRB) {
    local_2c = SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN;
  }
  HandleUB.Flags = (BIND_SHADER_RESOURCES_FLAGS *)((long)&StaleVarTypes_local + 4);
  HandleUB.pResourceMapping = &stack0xffffffffffffffe8;
  HandleUB.StaleVarTypes = pSStack_28;
  HandleUB.AllowedTypes = &local_2c;
  HandleTexture.Flags = (BIND_SHADER_RESOURCES_FLAGS *)((long)&StaleVarTypes_local + 4);
  HandleTexture.pResourceMapping = &stack0xffffffffffffffe8;
  HandleTexture.StaleVarTypes = pSStack_28;
  HandleTexture.AllowedTypes = &local_2c;
  HandleImage.Flags = (BIND_SHADER_RESOURCES_FLAGS *)((long)&StaleVarTypes_local + 4);
  HandleImage.pResourceMapping = &stack0xffffffffffffffe8;
  HandleImage.StaleVarTypes = pSStack_28;
  HandleImage.AllowedTypes = &local_2c;
  HandleStorageBuffer.Flags = (BIND_SHADER_RESOURCES_FLAGS *)((long)&StaleVarTypes_local + 4);
  HandleStorageBuffer.pResourceMapping = &stack0xffffffffffffffe8;
  HandleStorageBuffer.StaleVarTypes = pSStack_28;
  HandleStorageBuffer.AllowedTypes = &local_2c;
  HandleConstResources<Diligent::ShaderVariableManagerGL::CheckResources(Diligent::IResourceMapping*,Diligent::BIND_SHADER_RESOURCES_FLAGS,Diligent::SHADER_RESOURCE_VARIABLE_TYPE_FLAGS&)const::__0,Diligent::ShaderVariableManagerGL::CheckResources(Diligent::IResourceMapping*,Diligent::BIND_SHADER_RESOURCES_FLAGS,Diligent::SHADER_RESOURCE_VARIABLE_TYPE_FLAGS&)const::__1,Diligent::ShaderVariableManagerGL::CheckResources(Diligent::IResourceMapping*,Diligent::BIND_SHADER_RESOURCES_FLAGS,Diligent::SHADER_RESOURCE_VARIABLE_TYPE_FLAGS&)const::__2,Diligent::ShaderVariableManagerGL::CheckResources(Diligent::IResourceMapping*,Diligent::BIND_SHADER_RESOURCES_FLAGS,Diligent::SHADER_RESOURCE_VARIABLE_TYPE_FLAGS&)const::__3>
            (this,HandleUB,HandleTexture,HandleImage,HandleStorageBuffer);
  return;
}

Assistant:

void ShaderVariableManagerGL::CheckResources(IResourceMapping*                    pResourceMapping,
                                             BIND_SHADER_RESOURCES_FLAGS          Flags,
                                             SHADER_RESOURCE_VARIABLE_TYPE_FLAGS& StaleVarTypes) const
{
    if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) == 0)
        Flags |= BIND_SHADER_RESOURCES_UPDATE_ALL;

    const auto AllowedTypes = m_ResourceCache.GetContentType() == ResourceCacheContentType::SRB ?
        SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN :
        SHADER_RESOURCE_VARIABLE_TYPE_FLAG_STATIC;

    HandleConstResources(
        [&](const UniformBuffBindInfo& ub) {
            ub.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const TextureBindInfo& tex) {
            tex.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const ImageBindInfo& img) {
            img.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const StorageBufferBindInfo& ssbo) {
            ssbo.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        });
}